

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_draw_circle_lines(int center_x,int center_y,float radius,rf_color color)

{
  _Bool _Var1;
  float fVar2;
  float fVar3;
  undefined8 local_20;
  rf_int i;
  float radius_local;
  int center_y_local;
  int center_x_local;
  rf_color color_local;
  
  _Var1 = rf_gfx_check_buffer_limit(0x48);
  if (_Var1) {
    rf_gfx_draw();
  }
  rf_gfx_begin(RF_LINES);
  center_y_local._0_1_ = color.r;
  center_y_local._1_1_ = color.g;
  center_y_local._2_1_ = color.b;
  center_y_local._3_1_ = color.a;
  rf_gfx_color4ub((uchar)center_y_local,center_y_local._1_1_,center_y_local._2_1_,
                  center_y_local._3_1_);
  for (local_20 = 0; local_20 < 0x168; local_20 = local_20 + 10) {
    fVar2 = sinf((float)local_20 * 0.017453292);
    fVar3 = cosf((float)local_20 * 0.017453292);
    rf_gfx_vertex2f(fVar2 * radius + (float)center_x,fVar3 * radius + (float)center_y);
    fVar2 = sinf((float)(local_20 + 10) * 0.017453292);
    fVar3 = cosf((float)(local_20 + 10) * 0.017453292);
    rf_gfx_vertex2f(fVar2 * radius + (float)center_x,fVar3 * radius + (float)center_y);
  }
  rf_gfx_end();
  return;
}

Assistant:

RF_API void rf_draw_circle_lines(int center_x, int center_y, float radius, rf_color color)
{
    if (rf_gfx_check_buffer_limit(2 * 36)) rf_gfx_draw();

    rf_gfx_begin(RF_LINES);
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);

    // NOTE: Circle outline is drawn pixel by pixel every degree (0 to 360)
    for (rf_int i = 0; i < 360; i += 10)
    {
        rf_gfx_vertex2f(center_x + sinf(RF_DEG2RAD*i)*radius, center_y + cosf(RF_DEG2RAD*i)*radius);
        rf_gfx_vertex2f(center_x + sinf(RF_DEG2RAD*(i + 10))*radius, center_y + cosf(RF_DEG2RAD*(i + 10))*radius);
    }
    rf_gfx_end();
}